

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1513.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1513.c"
                  ,0x35,iVar2,uVar4);
  }
  if (iVar2 == 0) {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1513.c"
                    ,0x37);
      iVar2 = 0x7c;
    }
    else {
      iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1513.c"
                      ,0x39,iVar3,uVar4);
        iVar2 = iVar3;
      }
      if (iVar2 == 0) {
        iVar3 = curl_easy_setopt(lVar5,0xd,7);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1513.c"
                        ,0x3a,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 == 0) {
          iVar3 = curl_easy_setopt(lVar5,99,1);
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1513.c"
                          ,0x3b,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 == 0) {
            iVar3 = curl_easy_setopt(lVar5,0x4e58,progressKiller);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1513.c"
                            ,0x3c,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 == 0) {
              iVar3 = curl_easy_setopt(lVar5,0x2749,0);
              uVar1 = _stderr;
              iVar2 = 0;
              if (iVar3 != 0) {
                uVar4 = curl_easy_strerror(iVar3);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1513.c"
                              ,0x3d,iVar3,uVar4);
                iVar2 = iVar3;
              }
              if (iVar2 == 0) {
                iVar3 = curl_easy_setopt(lVar5,0x2b,0);
                uVar1 = _stderr;
                iVar2 = 0;
                if (iVar3 != 0) {
                  uVar4 = curl_easy_strerror(iVar3);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1513.c"
                                ,0x3e,iVar3,uVar4);
                  iVar2 = iVar3;
                }
                if (iVar2 == 0) {
                  iVar2 = curl_easy_perform(lVar5);
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar5);
    curl_global_cleanup();
  }
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_TIMEOUT, (long)7);
  easy_setopt(curl, CURLOPT_NOSIGNAL, (long)1);
  easy_setopt(curl, CURLOPT_PROGRESSFUNCTION, progressKiller);
  easy_setopt(curl, CURLOPT_PROGRESSDATA, NULL);
  easy_setopt(curl, CURLOPT_NOPROGRESS, (long)0);

  res = curl_easy_perform(curl);

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}